

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O1

GArray * g_array_sized_new(gboolean zero_terminated,gboolean clear,guint elt_size,
                          guint reserved_size)

{
  GRealArray *array;
  
  array = (GRealArray *)g_slice_alloc(0x20);
  array->data = (guint8 *)0x0;
  array->len = 0;
  array->alloc = 0;
  array->field_0x14 = (clear != 0) * '\x02' | zero_terminated != 0 | array->field_0x14 & 0xfc;
  array->elt_size = elt_size;
  array->clear_func = (GDestroyNotify)0x0;
  if (zero_terminated != 0 || reserved_size != 0) {
    g_array_maybe_expand(array,reserved_size);
    if ((array->field_0x14 & 1) != 0) {
      memset(array->data + array->len * array->elt_size,0,(ulong)array->elt_size);
    }
  }
  return (GArray *)array;
}

Assistant:

GArray* g_array_sized_new (gboolean zero_terminated,
        gboolean clear,
        guint    elt_size,
        guint    reserved_size)
{
    GRealArray *array;

    g_return_val_if_fail (elt_size > 0, NULL);

    array = g_slice_new (GRealArray);

    array->data            = NULL;
    array->len             = 0;
    array->alloc           = 0;
    array->zero_terminated = (zero_terminated ? 1 : 0);
    array->clear           = (clear ? 1 : 0);
    array->elt_size        = elt_size;
    array->clear_func      = NULL;

    // g_atomic_ref_count_init (&array->ref_count);

    if (array->zero_terminated || reserved_size != 0)
    {
        g_array_maybe_expand (array, reserved_size);
        g_array_zero_terminate(array);
    }

    return (GArray*) array;
}